

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

void * Intp_ManUnsatCore(Intp_Man_t *p,Sto_Man_t *pCnf,int fLearned,int fVerbose)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  int iVar4;
  int iVar5;
  abctime aVar6;
  FILE *pFVar7;
  Vec_Int_t *pVVar8;
  abctime aVar9;
  Vec_Str_t *vVisited;
  char *__s;
  uint uVar10;
  int iVar11;
  Sto_Cls_t *pSVar12;
  Sto_Man_t *pSVar13;
  
  aVar6 = Abc_Clock();
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3cc,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  p->pCnf = pCnf;
  p->fVerbose = fVerbose;
  Intp_ManResize(p);
  if (p->fProofWrite != 0) {
    pFVar7 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar7;
    p->Counter = 0;
  }
  p->vAntClas->nSize = 0;
  p->nAntStart = p->pCnf->nRoots;
  pSVar12 = (Sto_Cls_t *)&p->pCnf->pHead;
  while ((pSVar12 = pSVar12->pNext, pSVar12 != (Sto_Cls_t *)0x0 && ((pSVar12->field_0x1c & 2) != 0))
        ) {
    Intp_ManProofWriteOne(p,pSVar12);
  }
  iVar5 = Intp_ManProcessRoots(p);
  pSVar13 = p->pCnf;
  if (iVar5 != 0) {
    pSVar12 = (Sto_Cls_t *)&pSVar13->pHead;
    do {
      do {
        pSVar12 = pSVar12->pNext;
        if (pSVar12 == (Sto_Cls_t *)0x0) goto LAB_007113e3;
      } while ((pSVar12->field_0x1c & 2) != 0);
      iVar5 = Intp_ManProofRecordOne(p,pSVar12);
    } while (iVar5 != 0);
LAB_007113e3:
    pSVar13 = p->pCnf;
  }
  p_00 = p->vAntClas;
  if (pSVar13->pEmpty->Id - p->nAntStart == p_00->nSize + -1) {
    pVVar8 = Vec_IntAlloc(0);
    Vec_PtrPush(p_00,pVVar8);
    if (p->fProofWrite != 0) {
      fclose((FILE *)p->pFile);
      p->pFile = (FILE *)0x0;
    }
    if (fVerbose != 0) {
      pSVar13 = p->pCnf;
      uVar1 = pSVar13->nVars;
      uVar2 = pSVar13->nRoots;
      uVar3 = p->Counter;
      uVar10 = pSVar13->nClauses - uVar2;
      iVar5 = Sto_ManMemoryReport(pSVar13);
      printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n",
             (double)(int)(uVar3 - uVar2) / (double)(int)uVar10,(double)iVar5 * 9.5367431640625e-07,
             (ulong)uVar1,(ulong)uVar2,(ulong)uVar10,(ulong)uVar3);
      aVar9 = Abc_Clock();
      p->timeTotal = p->timeTotal + (aVar9 - aVar6);
    }
    pVVar8 = Vec_IntAlloc(1000);
    pSVar13 = p->pCnf;
    iVar5 = pSVar13->pEmpty->Id;
    __n = (long)iVar5 + 1;
    vVisited = (Vec_Str_t *)malloc(0x10);
    iVar11 = (int)__n;
    iVar4 = 0x10;
    if (0xe < (ulong)(long)iVar5) {
      iVar4 = iVar11;
    }
    vVisited->nCap = iVar4;
    if (iVar4 == 0) {
      __s = (char *)0x0;
    }
    else {
      __s = (char *)malloc((long)iVar4);
    }
    vVisited->pArray = __s;
    vVisited->nSize = iVar11;
    memset(__s,0,__n);
    Intp_ManUnsatCore_rec(p->vAntClas,iVar5,pVVar8,pSVar13->nRoots,vVisited,fLearned);
    free(__s);
    free(vVisited);
    if (fVerbose != 0) {
      uVar1 = p->pCnf->nRoots;
      printf("Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n",(ulong)uVar1,
             (ulong)(p->pCnf->nClauses - uVar1),(ulong)(uint)pVVar8->nSize);
    }
    return pVVar8;
  }
  __assert_fail("p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                ,0x3f7,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
}

Assistant:

void * Intp_ManUnsatCore( Intp_Man_t * p, Sto_Man_t * pCnf, int fLearned, int fVerbose )
{
    Vec_Int_t * vCore;
    Vec_Str_t * vVisited;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;

    // adjust the manager
    Intp_ManResize( p ); 

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
//    Vec_IntClear( p->vAnties );
//    Vec_IntFill( p->vBreaks, p->pCnf->nRoots, 0 );
    Vec_PtrClear( p->vAntClas );
    p->nAntStart = p->pCnf->nRoots;

    Sto_ManForEachClauseRoot( p->pCnf, pClause )
        Intp_ManProofWriteOne( p, pClause );

    // propagate root level assignments
    if ( Intp_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Intp_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
        }
    }

    // add the last breaker
//    assert( p->pCnf->pEmpty->Id == Vec_IntSize(p->vBreaks) - 1 );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
    assert( p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1 );
    Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );

    // stop the proof
    if ( p->fProofWrite )
    {
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Core", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    // derive the UNSAT core
    vCore = Vec_IntAlloc( 1000 );
    vVisited = Vec_StrStart( p->pCnf->pEmpty->Id+1 );
    Intp_ManUnsatCore_rec( p->vAntClas, p->pCnf->pEmpty->Id, vCore, p->pCnf->nRoots, vVisited, fLearned );
    Vec_StrFree( vVisited );
    if ( fVerbose )
        printf( "Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n", 
            p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, Vec_IntSize(vCore) );
//    Intp_ManUnsatCoreVerify( p->pCnf, vCore );
    return vCore;   
}